

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemFile.cpp
# Opt level: O2

int __thiscall MemFile::open(MemFile *this,char *__file,int __oflag,...)

{
  string *path;
  const_iterator __position;
  bool bVar1;
  iterator iVar2;
  undefined8 uVar3;
  long lVar4;
  long in_R8;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  __position._M_current =
       (this->m_data).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((this->m_data).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != __position._M_current) {
    (this->m_data).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current;
  }
  iVar2 = std::vector<unsigned_char,std::allocator<unsigned_char>>::
          insert<unsigned_char_const*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_data,__position
                     ,(uchar *)__file,(uchar *)(__file + __oflag));
  (this->m_it)._M_current = iVar2._M_current;
  std::__cxx11::string::_M_assign((string *)this);
  path = &this->m_filename;
  uVar3 = std::__cxx11::string::_M_assign((string *)path);
  if (*(long *)(in_R8 + 8) == 0) {
    lVar4 = std::__cxx11::string::rfind((char)this,0x2f);
    if (lVar4 == -1) {
      std::__cxx11::string::string((string *)&local_60,(string *)this);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_60,(ulong)this);
    }
    std::__cxx11::string::operator=((string *)path,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"gz",&local_61);
    bVar1 = IsFileExt(path,&local_60);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"xz",&local_62);
      bVar1 = IsFileExt(path,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      if (!bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,"bz2",(allocator<char> *)&local_40);
        bVar1 = IsFileExt(path,&local_60);
        uVar3 = std::__cxx11::string::~string((string *)&local_60);
        if (!bVar1) goto LAB_0016d859;
      }
    }
    std::__cxx11::string::substr((ulong)&local_60,(ulong)path);
    std::__cxx11::string::operator=((string *)path,(string *)&local_60);
    uVar3 = std::__cxx11::string::~string((string *)&local_60);
  }
LAB_0016d859:
  return (int)CONCAT71((int7)((ulong)uVar3 >> 8),1);
}

Assistant:

bool MemFile::open(const void* buf, int len, const std::string& path_, const std::string& filename_)
{
    auto pb = reinterpret_cast<const uint8_t*>(buf);

    m_data.clear();
    m_it = m_data.insert(m_data.begin(), pb, pb + len);
    m_path = path_;
    m_filename = filename_;

    // If a filename wasn't supplied from an archive, determine it here.
    if (filename_.empty())
    {
        std::string::size_type pos = m_path.rfind(PATH_SEPARATOR_CHR);
        m_filename = (pos == m_path.npos) ? m_path : m_path.substr(pos + 1);

        // Remove the archive extension from single compressed files.
        if (IsFileExt(m_filename, "gz") || IsFileExt(m_filename, "xz"))
            m_filename = m_filename.substr(0, m_filename.size() - 3);
        else if (IsFileExt(m_filename, "bz2"))
            m_filename = m_filename.substr(0, m_filename.size() - 4);
    }

    return true;
}